

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

bool __thiscall
Sudoku::fieldCheck(Sudoku *this,
                  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                  FieldVector *testFields,bool recordFullFurtherWays,bool debug)

{
  bool bVar1;
  int iVar2;
  int posX;
  int posY;
  int posZ;
  int value;
  element_type *peVar3;
  ostream *poVar4;
  reference pvVar5;
  element_type *this_00;
  undefined1 local_68 [40];
  shared_ptr<Field> *testField;
  iterator __end1;
  iterator __begin1;
  FieldVector *__range1;
  bool restart;
  bool debug_local;
  bool recordFullFurtherWays_local;
  FieldVector *testFields_local;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays__local;
  Sudoku *this_local;
  
  __end1 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::begin
                     (testFields);
  testField = (shared_ptr<Field> *)
              std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::end
                        (testFields);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                                *)&testField);
    if (!bVar1) {
      return false;
    }
    local_68._32_8_ =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
         ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_68._32_8_);
    iVar2 = Field::value(peVar3);
    if (iVar2 == 0) {
      peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_68._32_8_);
      iVar2 = Field::n_possible(peVar3);
      if (iVar2 == 1) {
        if (debug) {
          poVar4 = std::operator<<((ostream *)&std::cout,"  Field check: field (");
          std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_68._32_8_);
          Field::pos_abi_cxx11_((Field *)local_68);
          poVar4 = std::operator<<(poVar4,(string *)local_68);
          poVar4 = std::operator<<(poVar4,") must be ");
          peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68._32_8_);
          iVar2 = Field::onePossibleValue(peVar3);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
          poVar4 = std::operator<<(poVar4,"");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_68);
        }
        pvVar5 = std::__cxx11::list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>::back
                           (furtherWays_);
        pvVar5->nFieldCheckMatches = pvVar5->nFieldCheckMatches + 1;
        pvVar5 = std::__cxx11::list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>::back
                           (furtherWays_);
        peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_68._32_8_);
        iVar2 = Field::id(peVar3);
        peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_68._32_8_);
        posX = Field::pos_x(peVar3);
        peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_68._32_8_);
        posY = Field::pos_y(peVar3);
        peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_68._32_8_);
        posZ = Field::pos_z(peVar3);
        peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_68._32_8_);
        value = Field::onePossibleValue(peVar3);
        FurtherWays::addWay(pvVar5,iVar2,posX,posY,posZ,value,onlyPossibilityInField);
        if (!recordFullFurtherWays) {
          peVar3 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68._32_8_);
          this_00 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_68._32_8_);
          iVar2 = Field::onePossibleValue(this_00);
          Field::setValue(peVar3,iVar2);
          return true;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool Sudoku::fieldCheck(std::list<FurtherWays> &furtherWays_, FieldVector &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  // check if there are fields that can have only one possible value
  restart = false;

  // loop over fields
  for(auto &testField : testFields)
  {
    if(testField->value() == 0)   // if value is not yet set
    {
      if(testField->n_possible() == 1)    // if there is exactly one possiblility
      {
        if(debug)
          std::cout<<"  Field check: field ("<<testField->pos()<<") must be "<<testField->onePossibleValue()<<""<<std::endl;

        furtherWays_.back().nFieldCheckMatches++;
        furtherWays_.back().addWay(testField->id(), testField->pos_x(), testField->pos_y(), testField->pos_z(),
          testField->onePossibleValue(), FurtherWays::Reason::onlyPossibilityInField);

        if(!recordFullFurtherWays)
        {
          testField->setValue(testField->onePossibleValue());
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }
  return restart;
}